

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AcceptServerConnect(connectdata *conn)

{
  Curl_easy *data_00;
  int iVar1;
  socklen_t local_ac;
  int error;
  curl_socklen_t size;
  Curl_sockaddr_storage add;
  curl_socket_t s;
  curl_socket_t sock;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  add.buffer.sa_stor.__ss_align._4_4_ = conn->sock[1];
  add.buffer.sa_stor.__ss_align._0_4_ = 0xffffffff;
  local_ac = 0x80;
  iVar1 = getsockname(add.buffer.sa_stor.__ss_align._4_4_,(sockaddr *)&error,&local_ac);
  if (iVar1 == 0) {
    local_ac = 0x80;
    add.buffer.sa_stor.__ss_align._0_4_ =
         accept(add.buffer.sa_stor.__ss_align._4_4_,(sockaddr *)&error,&local_ac);
  }
  Curl_closesocket(conn,add.buffer.sa_stor.__ss_align._4_4_);
  if (add.buffer.sa_stor.__ss_align._0_4_ == -1) {
    Curl_failf(data_00,"Error accept()ing server connect");
    conn_local._4_4_ = CURLE_FTP_PORT_FAILED;
  }
  else {
    Curl_infof(data_00,"Connection accepted from server\n");
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff;
    conn->sock[1] = add.buffer.sa_stor.__ss_align._0_4_;
    curlx_nonblock(add.buffer.sa_stor.__ss_align._0_4_,1);
    conn->sock_accepted[1] = true;
    if ((data_00->set).fsockopt != (curl_sockopt_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      iVar1 = (*(data_00->set).fsockopt)
                        ((data_00->set).sockopt_client,add.buffer.sa_stor.__ss_align._0_4_,
                         CURLSOCKTYPE_ACCEPT);
      Curl_set_in_callback(data_00,false);
      if (iVar1 != 0) {
        close_secondarysocket(conn);
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode AcceptServerConnect(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s = accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server\n");
  /* when this happens within the DO state it is important that we mark us as
     not needing DO_MORE anymore */
  conn->bits.do_more = FALSE;

  conn->sock[SECONDARYSOCKET] = s;
  (void)curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->sock_accepted[SECONDARYSOCKET] = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);
    Curl_set_in_callback(data, false);

    if(error) {
      close_secondarysocket(conn);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}